

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hh
# Opt level: O0

int avro::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int extraout_EAX;
  ulong uVar1;
  StreamWriter w;
  size_t n;
  uint8_t *p;
  OutputStream *in_stack_ffffffffffffffc8;
  StreamWriter *in_stack_ffffffffffffffd0;
  uint8_t *in_stack_ffffffffffffffd8;
  StreamWriter *this;
  undefined8 local_18;
  EVP_PKEY_CTX *local_10;
  EVP_PKEY_CTX *local_8;
  
  local_18 = 0;
  this = (StreamWriter *)0x0;
  local_10 = src;
  local_8 = dst;
  StreamWriter::StreamWriter(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  while( true ) {
    uVar1 = (**(code **)(*(long *)local_8 + 0x10))(local_8,&local_18,&stack0xffffffffffffffe0);
    if ((uVar1 & 1) == 0) break;
    StreamWriter::writeBytes(this,in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0);
  }
  StreamWriter::flush(in_stack_ffffffffffffffd0);
  return extraout_EAX;
}

Assistant:

inline void copy(InputStream& in, OutputStream& out)
{
    const uint8_t *p = 0;
    size_t n = 0;
    StreamWriter w(out);
    while (in.next(&p, &n)) {
        w.writeBytes(p, n);
    }
    w.flush();
}